

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_func_queue_examples.cpp
# Opt level: O0

void density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::
     func_queue_reentrant_misc_samples(ostream *param_1)

{
  ControlBlock **ppCVar1;
  bool bVar2;
  bool bVar3;
  int *piVar4;
  anon_class_1_0_00000001 local_211;
  undefined1 local_210 [8];
  conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  queue_5;
  type result_2;
  conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue_1_2;
  conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue_4;
  type result_1;
  conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue_1_1;
  conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue_3;
  type result;
  type queue_1;
  anon_class_1_0_00000001 local_81;
  undefined1 local_80 [8];
  conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue_2;
  conc_function_queue<int_(float,_double),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue;
  ostream *param_4_local;
  
  density::
  conc_function_queue<int_(float,_double),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::conc_function_queue
            ((conc_function_queue<int_(float,_double),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&queue_2.m_queue.m_queue.m_tail);
  bVar2 = density::
          conc_function_queue<int_(float,_double),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
          ::empty((conc_function_queue<int_(float,_double),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                   *)&queue_2.m_queue.m_queue.m_tail);
  if (!bVar2) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                  ,0x1c4,
                  "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_misc_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  density::
  conc_function_queue<int_(float,_double),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<int_(float,_double),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&queue_2.m_queue.m_queue.m_tail);
  density::
  conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::conc_function_queue
            ((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)local_80);
  density::
  conc_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_misc_samples(std::ostream&)::_lambda()_1_>
            ((conc_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)local_80,&local_81);
  density::
  conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::conc_function_queue
            ((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&result,
             (conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)local_80);
  bVar2 = density::
          conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
          ::empty((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                   *)local_80);
  if (!bVar2) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                  ,0x1ce,
                  "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_misc_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  density::
  conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::try_consume((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                 *)&queue_3.m_queue.m_queue.m_tail);
  bVar3 = density::builtin_optional::operator_cast_to_bool
                    ((builtin_optional *)&queue_3.m_queue.m_queue.m_tail);
  bVar2 = false;
  if (bVar3) {
    piVar4 = density::builtin_optional<int>::operator*
                       ((builtin_optional<int> *)&queue_3.m_queue.m_queue.m_tail);
    bVar2 = *piVar4 == 6;
  }
  if (!bVar2) {
    __assert_fail("result && *result == 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                  ,0x1d1,
                  "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_misc_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  density::builtin_optional<int>::~builtin_optional
            ((builtin_optional<int> *)&queue_3.m_queue.m_queue.m_tail);
  density::
  conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&result);
  density::
  conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~conc_function_queue
            ((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)local_80);
  ppCVar1 = &queue_1_1.m_queue.m_queue.m_tail;
  density::
  conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::conc_function_queue
            ((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)ppCVar1);
  density::
  conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::conc_function_queue
            ((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
              *)&result_1.m_has_value);
  density::
  conc_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
  ::
  push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_misc_samples(std::ostream&)::_lambda()_2_>
            ((conc_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
              *)ppCVar1,(anon_class_1_0_00000001 *)(result_1.m_storage.__data + 3));
  density::
  conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::operator=((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
               *)&result_1.m_has_value,
              (conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
               *)&queue_1_1.m_queue.m_queue.m_tail);
  density::
  conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::try_consume((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                 *)((long)&queue_4.m_queue.m_queue.m_tail + 4));
  bVar3 = density::builtin_optional::operator_cast_to_bool
                    ((builtin_optional *)((long)&queue_4.m_queue.m_queue.m_tail + 4));
  bVar2 = false;
  if (bVar3) {
    piVar4 = density::builtin_optional<int>::operator*
                       ((builtin_optional<int> *)((long)&queue_4.m_queue.m_queue.m_tail + 4));
    bVar2 = *piVar4 == 6;
  }
  if (bVar2) {
    density::builtin_optional<int>::~builtin_optional
              ((builtin_optional<int> *)((long)&queue_4.m_queue.m_queue.m_tail + 4));
    density::
    conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
    ::~conc_function_queue
              ((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                *)&result_1.m_has_value);
    density::
    conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
    ::~conc_function_queue
              ((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                *)&queue_1_1.m_queue.m_queue.m_tail);
    ppCVar1 = &queue_1_2.m_queue.m_queue.m_tail;
    density::
    conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
    ::conc_function_queue
              ((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                *)ppCVar1);
    density::
    conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
    ::conc_function_queue
              ((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                *)&result_2.m_has_value);
    density::
    conc_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
    ::
    push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_misc_samples(std::ostream&)::_lambda()_3_>
              ((conc_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>
                *)ppCVar1,(anon_class_1_0_00000001 *)(result_2.m_storage.__data + 3));
    std::
    swap<density::conc_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)1>>
              ((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                *)&queue_1_2.m_queue.m_queue.m_tail,
               (conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                *)&result_2.m_has_value);
    bVar2 = density::
            conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
            ::empty((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                     *)&queue_1_2.m_queue.m_queue.m_tail);
    if (!bVar2) {
      __assert_fail("queue.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                    ,0x1e8,
                    "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_misc_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                   );
    }
    density::
    conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
    ::try_consume((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                   *)((long)&queue_5.m_queue.m_queue.m_tail + 4));
    bVar3 = density::builtin_optional::operator_cast_to_bool
                      ((builtin_optional *)((long)&queue_5.m_queue.m_queue.m_tail + 4));
    bVar2 = false;
    if (bVar3) {
      piVar4 = density::builtin_optional<int>::operator*
                         ((builtin_optional<int> *)((long)&queue_5.m_queue.m_queue.m_tail + 4));
      bVar2 = *piVar4 == 6;
    }
    if (bVar2) {
      density::builtin_optional<int>::~builtin_optional
                ((builtin_optional<int> *)((long)&queue_5.m_queue.m_queue.m_tail + 4));
      density::
      conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
      ::~conc_function_queue
                ((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                  *)&result_2.m_has_value);
      density::
      conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
      ::~conc_function_queue
                ((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                  *)&queue_1_2.m_queue.m_queue.m_tail);
      density::
      conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
      ::conc_function_queue
                ((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                  *)local_210);
      density::
      conc_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
      ::
      push<density_tests::ConcFunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_misc_samples(std::ostream&)::_lambda()_4_>
                ((conc_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
                  *)local_210,&local_211);
      density::
      conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
      ::clear<(density::function_type_erasure)0,_nullptr>
                ((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                  *)local_210);
      bVar2 = density::
              conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
              ::empty((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                       *)local_210);
      if (bVar2) {
        density::
        conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
        ::~conc_function_queue
                  ((conc_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                    *)local_210);
        return;
      }
      __assert_fail("queue.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                    ,500,
                    "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_misc_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                   );
    }
    __assert_fail("result && *result == 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                  ,0x1eb,
                  "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_misc_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  __assert_fail("result && *result == 6",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/conc_func_queue_examples.cpp"
                ,0x1dd,
                "static void density_tests::ConcFunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_misc_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
               );
}

Assistant:

static void func_queue_reentrant_misc_samples(std::ostream &)
        {
            using namespace density;

            {
                //! [conc_function_queue default construct example 1]
                conc_function_queue<int(float, double), default_allocator, ERASURE> queue;
                assert(queue.empty());
                //! [conc_function_queue default construct example 1]
            }

            {
                //! [conc_function_queue move construct example 1]
                conc_function_queue<int(), default_allocator, ERASURE> queue;
                queue.push([] { return 6; });

                auto queue_1(std::move(queue));
                assert(queue.empty());

                auto result = queue_1.try_consume();
                assert(result && *result == 6);
                //! [conc_function_queue move construct example 1]
            }

            {
                //! [conc_function_queue move assign example 1]
                conc_function_queue<int(), default_allocator, ERASURE> queue, queue_1;
                queue.push([] { return 6; });

                queue_1 = std::move(queue);

                auto result = queue_1.try_consume();
                assert(result && *result == 6);
                //! [conc_function_queue move assign example 1]
            }


            {
                //! [conc_function_queue swap example 1]
                conc_function_queue<int(), default_allocator, ERASURE> queue, queue_1;
                queue.push([] { return 6; });

                std::swap(queue, queue_1);
                assert(queue.empty());

                auto result = queue_1.try_consume();
                assert(result && *result == 6);
                //! [conc_function_queue swap example 1]
            }

            {
                //! [conc_function_queue clear example 1]
                conc_function_queue<int(), default_allocator, function_standard_erasure> queue;
                queue.push([] { return 6; });
                queue.clear();
                assert(queue.empty());
                //! [conc_function_queue clear example 1]
            }
        }